

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferViewCreateTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::api::anon_unknown_0::BufferViewTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BufferViewTestInstance *this)

{
  VkDevice *ppVVar1;
  int iVar2;
  VkDevice device;
  DeviceInterface *vk;
  InstanceInterface *pIVar3;
  VkPhysicalDevice pVVar4;
  ostream *poVar5;
  NotSupportedError *this_00;
  Move<vk::Handle<(vk::HandleType)12>_> bufferView;
  Move<vk::Handle<(vk::HandleType)7>_> memory;
  Move<vk::Handle<(vk::HandleType)8>_> testBuffer;
  VkMemoryAllocateInfo memAlloc;
  deUint32 queueFamilyIndex;
  VkMemoryRequirements memReqs;
  VkFormatProperties properties;
  VkBufferCreateInfo bufferParams;
  ostringstream errorMsg;
  Move<vk::Handle<(vk::HandleType)12>_> local_318;
  Move<vk::Handle<(vk::HandleType)8>_> local_2f8;
  VkBufferView local_2d8;
  Deleter<vk::Handle<(vk::HandleType)12>_> aDStack_2d0 [3];
  VkDeviceMemory local_278;
  Deleter<vk::Handle<(vk::HandleType)7>_> DStack_270;
  VkBuffer local_258;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_250;
  VkMemoryAllocateInfo local_230;
  deUint32 local_20c;
  ulong local_208 [2];
  uint local_1f8;
  undefined1 local_1ec [8];
  uint local_1e4;
  VkBufferCreateInfo local_1e0;
  undefined1 local_1a8 [16];
  VkAllocationCallbacks local_198 [2];
  ios_base local_138 [272];
  
  device = Context::getDevice((this->super_TestInstance).m_context);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  local_20c = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  local_1e0.pQueueFamilyIndices = &local_20c;
  DStack_250.m_device = (VkDevice)0x0;
  DStack_250.m_allocator = (VkAllocationCallbacks *)0x0;
  local_258.m_internal = 0;
  DStack_250.m_deviceIface = (DeviceInterface *)0x0;
  local_1e0.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_1e0.pNext = (void *)0x0;
  local_1e0.flags = 0;
  local_1e0.size = 0x1a40;
  local_1e0.usage = (this->m_testCase).usage;
  local_1e0.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_1e0.queueFamilyIndexCount = 1;
  pIVar3 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  (*pIVar3->_vptr_InstanceInterface[3])(pIVar3,pVVar4,(ulong)(this->m_testCase).format,local_1ec);
  if ((local_1e4 & (this->m_testCase).features) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Format not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferViewCreateTests.cpp"
               ,0x75);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  ::vk::createBuffer(&local_2f8,vk,device,&local_1e0,(VkAllocationCallbacks *)0x0);
  local_198[0].pUserData =
       local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  local_198[0].pfnAllocation =
       (PFN_vkAllocationFunction)
       local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_1a8._0_8_ = local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_1a8._8_8_ =
       local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_258.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_250,local_258);
  }
  DStack_250.m_device = (VkDevice)local_198[0].pUserData;
  DStack_250.m_allocator = (VkAllocationCallbacks *)local_198[0].pfnAllocation;
  local_258.m_internal = local_1a8._0_8_;
  DStack_250.m_deviceIface = (DeviceInterface *)local_1a8._8_8_;
  if (local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  (*vk->_vptr_DeviceInterface[0xe])(vk,device,local_258.m_internal,local_208);
  if (local_208[0] < 0x1a40) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Requied memory size (",0x15);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," bytes) smaller than the buffer\'s size (",0x28);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," bytes)!",8);
    std::__cxx11::stringbuf::str();
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
               (undefined1 *)
               ((long)&(local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                       m_deviceIface)->_vptr_DeviceInterface +
               local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal));
    if ((VkDevice *)local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
        != &local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device) {
      operator_delete((void *)local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                              m_internal,
                      (ulong)(local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter
                              .m_device + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    DStack_270.m_device = (VkDevice)0x0;
    DStack_270.m_allocator = (VkAllocationCallbacks *)0x0;
    local_278.m_internal = 0;
    DStack_270.m_deviceIface = (DeviceInterface *)0x0;
    local_230.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
    local_230.pNext = (void *)0x0;
    local_230.allocationSize = local_208[0];
    if (local_1f8 == 0) {
      local_230.memoryTypeIndex = 0x20;
    }
    else {
      local_230.memoryTypeIndex = 0;
      if (local_1f8 != 0) {
        for (; (local_1f8 >> local_230.memoryTypeIndex & 1) == 0;
            local_230.memoryTypeIndex = local_230.memoryTypeIndex + 1) {
        }
      }
    }
    aDStack_2d0[0].m_device = (VkDevice)0x0;
    aDStack_2d0[0].m_allocator = (VkAllocationCallbacks *)0x0;
    local_2d8.m_internal = 0;
    aDStack_2d0[0].m_deviceIface = (DeviceInterface *)0x0;
    local_1a8._0_4_ = 0xd;
    local_1a8._8_8_ = (DeviceInterface *)0x0;
    local_198[0].pUserData = (void *)((ulong)local_198[0].pUserData & 0xffffffff00000000);
    local_198[0].pfnAllocation = (PFN_vkAllocationFunction)local_258.m_internal;
    local_198[0].pfnReallocation._0_4_ = (this->m_testCase).format;
    local_198[0].pfnFree = (PFN_vkFreeFunction)(this->m_testCase).offset;
    local_198[0].pfnInternalAllocation =
         (PFN_vkInternalAllocationNotification)(this->m_testCase).range;
    ::vk::allocateMemory
              ((Move<vk::Handle<(vk::HandleType)7>_> *)&local_318,vk,device,&local_230,
               (VkAllocationCallbacks *)0x0);
    local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
    local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
    local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
    local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
    local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal = 0;
    local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    if (local_278.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()(&DStack_270,local_278);
    }
    DStack_270.m_device =
         local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
    DStack_270.m_allocator =
         local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
    local_278.m_internal =
         local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
    DStack_270.m_deviceIface =
         local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
    if (local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)7>_> *)
                 &local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
                 (VkDeviceMemory)
                 local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal);
    }
    iVar2 = (*vk->_vptr_DeviceInterface[0xc])(vk,device,local_258.m_internal,local_278.m_internal);
    if (iVar2 == 0) {
      ::vk::createBufferView
                (&local_318,vk,device,(VkBufferViewCreateInfo *)local_1a8,
                 (VkAllocationCallbacks *)0x0);
      local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
           local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
      local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
           local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
      local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
           local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
      local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
           local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
      local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal = 0;
      local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      if (local_2d8.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                  (aDStack_2d0,local_2d8);
      }
      aDStack_2d0[0].m_device =
           local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
      aDStack_2d0[0].m_allocator =
           local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
      local_2d8.m_internal =
           local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
      aDStack_2d0[0].m_deviceIface =
           local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
      if (local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                  (&local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
                   (VkBufferView)
                   local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal
                  );
      }
      if (local_2d8.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                  (aDStack_2d0,local_2d8);
      }
      aDStack_2d0[0].m_device = (VkDevice)0x0;
      aDStack_2d0[0].m_allocator = (VkAllocationCallbacks *)0x0;
      local_2d8.m_internal = 0;
      aDStack_2d0[0].m_deviceIface = (DeviceInterface *)0x0;
      local_1a8._0_4_ = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
      local_1a8._8_8_ = (DeviceInterface *)0x0;
      local_198[0].pUserData = (void *)((ulong)local_198[0].pUserData & 0xffffffff00000000);
      local_198[0].pfnAllocation = (PFN_vkAllocationFunction)local_258.m_internal;
      local_198[0].pfnReallocation._0_4_ = (this->m_testCase).format;
      local_198[0].pfnFree = (PFN_vkFreeFunction)(this->m_testCase).offset;
      local_198[0].pfnInternalAllocation = (PFN_vkInternalAllocationNotification)0x1a40;
      ::vk::createBufferView
                (&local_318,vk,device,(VkBufferViewCreateInfo *)local_1a8,
                 (VkAllocationCallbacks *)0x0);
      local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
           local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
      local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
           local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
      local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
           local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
      local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
           local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
      local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal = 0;
      local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      if (local_2d8.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                  (aDStack_2d0,local_2d8);
      }
      aDStack_2d0[0].m_device =
           local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
      aDStack_2d0[0].m_allocator =
           local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
      local_2d8.m_internal =
           local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
      aDStack_2d0[0].m_deviceIface =
           local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
      if (local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                  (&local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
                   (VkBufferView)
                   local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal
                  );
      }
      if (local_2d8.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                  (aDStack_2d0,local_2d8);
      }
      local_1a8._0_8_ = local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"BufferView test","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_1a8._0_8_,
                 (long)(_func_int ***)local_1a8._8_8_ + local_1a8._0_8_);
      if ((VkAllocationCallbacks *)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198[0].pUserData + 1));
      }
    }
    else {
      ppVVar1 = &local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
      local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
           (deUint64)ppVVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f8,"Bind buffer memory failed!","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,
                 local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
                 (undefined1 *)
                 ((long)&(local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                         m_deviceIface)->_vptr_DeviceInterface +
                 local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal));
      if ((VkDevice *)
          local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
          ppVVar1) {
        operator_delete((void *)local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                object.m_internal,
                        (ulong)(local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                deleter.m_device + 1));
      }
      if (local_2d8.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                  (aDStack_2d0,local_2d8);
      }
    }
    if (local_278.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()(&DStack_270,local_278);
    }
  }
  if (local_258.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_250,local_258);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BufferViewTestInstance::iterate (void)
{
	// Create buffer
	const VkDevice				vkDevice				= m_context.getDevice();
	const DeviceInterface&		vk						= m_context.getDeviceInterface();
	const deUint32				queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();
	const VkDeviceSize			size					= 3 * 5 * 7 * 64;
	Move<VkBuffer>				testBuffer;
	VkMemoryRequirements		memReqs;
	VkFormatProperties			properties;
	const VkBufferCreateInfo	bufferParams =
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,													//	VkStructureType			sType;
		DE_NULL,																				//	const void*				pNext;
		0u,																						//	VkBufferCreateFlags		flags;
		size,																					//	VkDeviceSize			size;
		m_testCase.usage,																		//	VkBufferUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,																//	VkSharingMode			sharingMode;
		1u,																						//	deUint32				queueFamilyCount;
		&queueFamilyIndex,																		//	const deUint32*			pQueueFamilyIndices;
	};

	m_context.getInstanceInterface().getPhysicalDeviceFormatProperties(m_context.getPhysicalDevice(), m_testCase.format, &properties);
	if (!(properties.bufferFeatures & m_testCase.features))
		TCU_THROW(NotSupportedError, "Format not supported");

	try
	{
		testBuffer = createBuffer(vk, vkDevice, &bufferParams, (const VkAllocationCallbacks*)DE_NULL);
	}
	catch (const vk::Error& error)
	{
		return tcu::TestStatus::fail("Buffer creation failed! (Error code: " + de::toString(error.getMessage()) + ")");
	}

	vk.getBufferMemoryRequirements(vkDevice, *testBuffer, &memReqs);

	if (size > memReqs.size)
	{
		std::ostringstream errorMsg;
		errorMsg << "Requied memory size (" << memReqs.size << " bytes) smaller than the buffer's size (" << size << " bytes)!";
		return tcu::TestStatus::fail(errorMsg.str());
	}

	Move<VkDeviceMemory>		memory;
	const VkMemoryAllocateInfo	memAlloc				=
	{
		VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,		//	VkStructureType		sType
		NULL,										//	const void*			pNext
		memReqs.size,								//	VkDeviceSize		allocationSize
		(deUint32)deCtz32(memReqs.memoryTypeBits)	//	deUint32			memoryTypeIndex
	};

	{
		// Create buffer view.
		Move<VkBufferView>				bufferView;
		const VkBufferViewCreateInfo	bufferViewCreateInfo	=
		{
			VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO,	//	VkStructureType		sType;
			NULL,										//	const void*			pNext;
			(VkBufferViewCreateFlags)0,
			*testBuffer,								//	VkBuffer			buffer;
			m_testCase.format,							//	VkFormat			format;
			m_testCase.offset,							//	VkDeviceSize		offset;
			m_testCase.range,							//	VkDeviceSize		range;
		};

		try
		{
			memory = allocateMemory(vk, vkDevice, &memAlloc, (const VkAllocationCallbacks*)DE_NULL);
		}
		catch (const vk::Error& error)
		{
			return tcu::TestStatus::fail("Alloc memory failed! (Error code: " + de::toString(error.getMessage()) + ")");
		}

		if (vk.bindBufferMemory(vkDevice, *testBuffer, *memory, 0) != VK_SUCCESS)
			return tcu::TestStatus::fail("Bind buffer memory failed!");

		try
		{
			bufferView = createBufferView(vk, vkDevice, &bufferViewCreateInfo, (const VkAllocationCallbacks*)DE_NULL);
		}
		catch (const vk::Error& error)
		{
			return tcu::TestStatus::fail("Buffer View creation failed! (Error code: " + de::toString(error.getMessage()) + ")");
		}
	}

	// Testing complete view size.
	{
		Move<VkBufferView>		completeBufferView;
		VkBufferViewCreateInfo	completeBufferViewCreateInfo	=
		{
			VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO,	//	VkStructureType		sType;
			NULL,										//	const void*			pNext;
			(VkBufferViewCreateFlags)0,
			*testBuffer,								//	VkBuffer			buffer;
			m_testCase.format,							//	VkFormat			format;
			m_testCase.offset,							//	VkDeviceSize		offset;
			size,										//	VkDeviceSize		range;
		};

		try
		{
			completeBufferView = createBufferView(vk, vkDevice, &completeBufferViewCreateInfo, (const VkAllocationCallbacks*)DE_NULL);
		}
		catch (const vk::Error& error)
		{
			return tcu::TestStatus::fail("Buffer View creation failed! (Error code: " + de::toString(error.getMessage()) + ")");
		}
	}

	return tcu::TestStatus::pass("BufferView test");
}